

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O0

sljit_s32 sljit_emit_op2(sljit_compiler *compiler,sljit_s32 op,sljit_s32 dst,sljit_sw dstw,
                        sljit_s32 src1,sljit_sw src1w,sljit_s32 src2,sljit_sw src2w)

{
  sljit_s32 sVar1;
  sljit_sw src1w_local;
  sljit_s32 src1_local;
  sljit_sw dstw_local;
  sljit_s32 dst_local;
  sljit_s32 op_local;
  sljit_compiler *compiler_local;
  
  if (compiler->error == 0) {
    compiler->mode32 = op & 0x100;
    if ((dst == 0) && ((op & 0xfe00U) == 0)) {
      compiler_local._4_4_ = 0;
    }
    else {
      switch(op & 0xffff00ff) {
      case 0x60:
        if (((op & 0xfe00U) == 0) &&
           (sVar1 = emit_lea_binary(compiler,dst,dstw,src1,src1w,src2,src2w), sVar1 != 4)) {
          compiler_local._4_4_ = compiler->error;
        }
        else {
          compiler_local._4_4_ = emit_cum_binary(compiler,0x5030100,dst,dstw,src1,src1w,src2,src2w);
        }
        break;
      case 0x61:
        compiler_local._4_4_ = emit_cum_binary(compiler,0x15131110,dst,dstw,src1,src1w,src2,src2w);
        break;
      case 0x62:
        if ((((op & 0xfe00U) == 0) && ((src2 & 0x40U) != 0)) &&
           (sVar1 = emit_lea_binary(compiler,dst,dstw,src1,src1w,0x40,-src2w), sVar1 != 4)) {
          compiler_local._4_4_ = compiler->error;
        }
        else if (dst == 0) {
          compiler_local._4_4_ = emit_cmp_binary(compiler,src1,src1w,src2,src2w);
        }
        else {
          compiler_local._4_4_ =
               emit_non_cum_binary(compiler,0x2d2b2928,dst,dstw,src1,src1w,src2,src2w);
        }
        break;
      case 99:
        compiler_local._4_4_ =
             emit_non_cum_binary(compiler,0x1d1b1918,dst,dstw,src1,src1w,src2,src2w);
        break;
      case 100:
        compiler_local._4_4_ = emit_mul(compiler,dst,dstw,src1,src1w,src2,src2w);
        break;
      case 0x65:
        if (dst == 0) {
          compiler_local._4_4_ = emit_test_binary(compiler,src1,src1w,src2,src2w);
        }
        else {
          compiler_local._4_4_ = emit_cum_binary(compiler,0x25232120,dst,dstw,src1,src1w,src2,src2w)
          ;
        }
        break;
      case 0x66:
        compiler_local._4_4_ = emit_cum_binary(compiler,0xd0b0908,dst,dstw,src1,src1w,src2,src2w);
        break;
      case 0x67:
        compiler_local._4_4_ = emit_cum_binary(compiler,0x35333130,dst,dstw,src1,src1w,src2,src2w);
        break;
      case 0x68:
        compiler_local._4_4_ =
             emit_shift_with_flags(compiler,' ',op & 0xfe00,dst,dstw,src1,src1w,src2,src2w);
        break;
      case 0x69:
        compiler_local._4_4_ =
             emit_shift_with_flags(compiler,'(',op & 0xfe00,dst,dstw,src1,src1w,src2,src2w);
        break;
      case 0x6a:
        compiler_local._4_4_ =
             emit_shift_with_flags(compiler,'8',op & 0xfe00,dst,dstw,src1,src1w,src2,src2w);
        break;
      default:
        compiler_local._4_4_ = 0;
      }
    }
  }
  else {
    compiler_local._4_4_ = compiler->error;
  }
  return compiler_local._4_4_;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_op2(struct sljit_compiler *compiler, sljit_s32 op,
	sljit_s32 dst, sljit_sw dstw,
	sljit_s32 src1, sljit_sw src1w,
	sljit_s32 src2, sljit_sw src2w)
{
	CHECK_ERROR();
	CHECK(check_sljit_emit_op2(compiler, op, dst, dstw, src1, src1w, src2, src2w));
	ADJUST_LOCAL_OFFSET(dst, dstw);
	ADJUST_LOCAL_OFFSET(src1, src1w);
	ADJUST_LOCAL_OFFSET(src2, src2w);

	CHECK_EXTRA_REGS(dst, dstw, (void)0);
	CHECK_EXTRA_REGS(src1, src1w, (void)0);
	CHECK_EXTRA_REGS(src2, src2w, (void)0);
#if (defined SLJIT_CONFIG_X86_64 && SLJIT_CONFIG_X86_64)
	compiler->mode32 = op & SLJIT_I32_OP;
#endif

	if (dst == SLJIT_UNUSED && !HAS_FLAGS(op))
		return SLJIT_SUCCESS;

	switch (GET_OPCODE(op)) {
	case SLJIT_ADD:
		if (!HAS_FLAGS(op)) {
			if (emit_lea_binary(compiler, dst, dstw, src1, src1w, src2, src2w) != SLJIT_ERR_UNSUPPORTED)
				return compiler->error;
		}
		return emit_cum_binary(compiler, BINARY_OPCODE(ADD),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_ADDC:
		return emit_cum_binary(compiler, BINARY_OPCODE(ADC),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_SUB:
		if (!HAS_FLAGS(op)) {
			if ((src2 & SLJIT_IMM) && emit_lea_binary(compiler, dst, dstw, src1, src1w, SLJIT_IMM, -src2w) != SLJIT_ERR_UNSUPPORTED)
				return compiler->error;
		}

		if (dst == SLJIT_UNUSED)
			return emit_cmp_binary(compiler, src1, src1w, src2, src2w);
		return emit_non_cum_binary(compiler, BINARY_OPCODE(SUB),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_SUBC:
		return emit_non_cum_binary(compiler, BINARY_OPCODE(SBB),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_MUL:
		return emit_mul(compiler, dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_AND:
		if (dst == SLJIT_UNUSED)
			return emit_test_binary(compiler, src1, src1w, src2, src2w);
		return emit_cum_binary(compiler, BINARY_OPCODE(AND),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_OR:
		return emit_cum_binary(compiler, BINARY_OPCODE(OR),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_XOR:
		return emit_cum_binary(compiler, BINARY_OPCODE(XOR),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_SHL:
		return emit_shift_with_flags(compiler, SHL, HAS_FLAGS(op),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_LSHR:
		return emit_shift_with_flags(compiler, SHR, HAS_FLAGS(op),
			dst, dstw, src1, src1w, src2, src2w);
	case SLJIT_ASHR:
		return emit_shift_with_flags(compiler, SAR, HAS_FLAGS(op),
			dst, dstw, src1, src1w, src2, src2w);
	}

	return SLJIT_SUCCESS;
}